

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O1

bool IsRainbowArtsTrack(Track *track,int *weak_offset,int *weak_size)

{
  long *plVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Sector *this;
  Sector *this_00;
  Data *pDVar5;
  
  iVar4 = Track::size(track);
  if (iVar4 == 9) {
    this = Track::operator[](track,1);
    this_00 = Track::operator[](track,3);
    if (this->encoding != MFM) {
      return false;
    }
    if (this_00->encoding != MFM) {
      return false;
    }
    if (this->datarate != _250K) {
      return false;
    }
    if (this_00->datarate != _250K) {
      return false;
    }
    iVar4 = Sector::size(this);
    if (((iVar4 == 0x200) && (iVar4 = Sector::size(this_00), iVar4 == 0x200)) &&
       (iVar4 = Sector::data_size(this), 0x1ff < iVar4)) {
      iVar4 = Sector::data_size(this_00);
      if (iVar4 < 0x200) {
        return false;
      }
      if ((this->header).sector != 0xc6) {
        return false;
      }
      bVar3 = Sector::has_baddatacrc(this);
      if (bVar3) {
        pDVar5 = Sector::data_copy(this_00,0);
        plVar1 = (long *)(pDVar5->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
        bVar3 = *(long *)((long)plVar1 + 6) == 0x17021444d42edaf;
        bVar2 = *plVar1 == -0x1250fecffe5892d6;
        if (!bVar3 || !bVar2) {
          return bVar3 && bVar2;
        }
        *weak_offset = 100;
        *weak_size = 0x100;
        if (opt.debug == 0) {
          return true;
        }
        util::operator<<((LogHelper *)&util::cout,
                         (char (*) [41])"detected Rainbow Arts weak sector track\n");
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool IsRainbowArtsTrack(const Track& track, int& weak_offset, int& weak_size)
{
    if (track.size() != 9)
        return false;

    auto& sector1 = track[1];
    auto& sector3 = track[3];

    if (sector1.encoding != Encoding::MFM || sector3.encoding != Encoding::MFM ||
        sector1.datarate != DataRate::_250K || sector3.datarate != DataRate::_250K ||
        sector1.size() != 512 || sector3.size() != 512 ||
        sector1.data_size() < 512 || sector3.data_size() < 512 ||
        sector1.header.sector != 198 || !sector1.has_baddatacrc())  // weak sector 198
        return false;

    auto& data3 = sector3.data_copy();

    // Check for code signature at the start of the 4th sector
    if (memcmp(data3.data(), "\x2a\x6d\xa7\x01\x30\x01\xaf\xed\x42\x4d\x44\x21\x70\x01", 14))
        return false;

    // The first 100 bytes are constant
    weak_offset = 100;  // =100 -258 +151 -3
    weak_size = 256;

    if (opt.debug) util::cout << "detected Rainbow Arts weak sector track\n";
    return true;
}